

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void screen_byte_4(ubyte iobyte,uint address)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte local_16;
  byte local_15;
  ubyte colpix2;
  ubyte colpix1;
  uint bitsperline;
  uint virt_y_cord;
  uint y_cord;
  uint x_cord;
  uint address_local;
  ubyte iobyte_local;
  
  bitsperline = address;
  if (address < screen_start) {
    bitsperline = address + (-0x8000 - ram_screen_start);
  }
  uVar2 = bitsperline - screen_start;
  uVar3 = (uVar2 / (ushort)((ushort)crt_regs[1] << 3)) * 8 + (uVar2 & 7);
  uVar4 = uVar3 + (uVar3 >> 2);
  _colpix2 = (ushort)((ulong)uVar2 % ((ulong)crt_regs[1] << 3)) & 0xfff8;
  bVar1 = iobyte & 0xaa;
  if ((iobyte & 0xaa) == 0) {
    local_15 = 0;
  }
  else if (bVar1 == 2) {
    local_15 = 1;
  }
  else if (bVar1 == 8) {
    local_15 = 2;
  }
  else if (bVar1 == 10) {
    local_15 = 3;
  }
  else if (bVar1 == 0x20) {
    local_15 = 4;
  }
  else if (bVar1 == 0x22) {
    local_15 = 5;
  }
  else if (bVar1 == 0x28) {
    local_15 = 6;
  }
  else if (bVar1 == 0x2a) {
    local_15 = 7;
  }
  else if (bVar1 == 0x80) {
    local_15 = 8;
  }
  else if (bVar1 == 0x82) {
    local_15 = 9;
  }
  else if (bVar1 == 0x88) {
    local_15 = 10;
  }
  else if (bVar1 == 0x8a) {
    local_15 = 0xb;
  }
  else if (bVar1 == 0xa0) {
    local_15 = 0xc;
  }
  else if (bVar1 == 0xa2) {
    local_15 = 0xd;
  }
  else if (bVar1 == 0xa8) {
    local_15 = 0xe;
  }
  else if (bVar1 == 0xaa) {
    local_15 = 0xf;
  }
  switch(iobyte & 0x55) {
  case 0:
    local_16 = 0;
    break;
  case 1:
    local_16 = 1;
    break;
  case 4:
    local_16 = 2;
    break;
  case 5:
    local_16 = 3;
    break;
  case 0x10:
    local_16 = 4;
    break;
  case 0x11:
    local_16 = 5;
    break;
  case 0x14:
    local_16 = 6;
    break;
  case 0x15:
    local_16 = 7;
    break;
  case 0x40:
    local_16 = 8;
    break;
  case 0x41:
    local_16 = 9;
    break;
  case 0x44:
    local_16 = 10;
    break;
  case 0x45:
    local_16 = 0xb;
    break;
  case 0x50:
    local_16 = 0xc;
    break;
  case 0x51:
    local_16 = 0xd;
    break;
  case 0x54:
    local_16 = 0xe;
    break;
  case 0x55:
    local_16 = 0xf;
  }
  putpixel(_colpix2,uVar4,(uint)local_15);
  putpixel(_colpix2 + 1,uVar4,(uint)local_15);
  putpixel(_colpix2 + 2,uVar4,(uint)local_15);
  putpixel(_colpix2 + 3,uVar4,(uint)local_15);
  putpixel(_colpix2 + 4,uVar4,(uint)local_16);
  putpixel(_colpix2 + 5,uVar4,(uint)local_16);
  putpixel(_colpix2 + 6,uVar4,(uint)local_16);
  putpixel(_colpix2 + 7,uVar4,(uint)local_16);
  if ((uVar3 & 3) == 0) {
    uVar4 = uVar4 - 1;
    putpixel(_colpix2,uVar4,(uint)local_15);
    putpixel(_colpix2 + 1,uVar4,(uint)local_15);
    putpixel(_colpix2 + 2,uVar4,(uint)local_15);
    putpixel(_colpix2 + 3,uVar4,(uint)local_15);
    putpixel(_colpix2 + 4,uVar4,(uint)local_16);
    putpixel(_colpix2 + 5,uVar4,(uint)local_16);
    putpixel(_colpix2 + 6,uVar4,(uint)local_16);
    putpixel(_colpix2 + 7,uVar4,(uint)local_16);
  }
  return;
}

Assistant:

void screen_byte_4(ubyte iobyte, uint address) {
    uint x_cord = 0;                       // general x coordinate
    uint y_cord = 0;                       // general y coordinate
    uint virt_y_cord = 0;                  // scaled pc y coordinate
    uint bitsperline;                    // bits per scaline

    ubyte colpix1;                       // holds the colour of pixel 1
    ubyte colpix2;                       // holds the colour of pixel 2

    bitsperline = 8 * crt_regs[1];           // calculate bits per line

    // deal with hardware wraparound
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;
    y_cord = address / bitsperline;          // calculate the character row
    y_cord *= 8;                           // convert to the pixel row
    y_cord += (address % 8);                 // add fraction of character offset
    virt_y_cord += y_cord + y_cord / 4;        // scale output to fit screen


    x_cord = address % bitsperline;          // calcalate the character column
    x_cord &= 0xFFF8;                      // mask off the lower 3 bits

    switch (iobyte & 0xAA)                         // calculate the colour of pixel 1
    {
        case 0x00:
            colpix1 = 0x0;
            break;
        case 0x02:
            colpix1 = 0x1;
            break;
        case 0x08:
            colpix1 = 0x2;
            break;
        case 0x0A:
            colpix1 = 0x3;
            break;
        case 0x20:
            colpix1 = 0x4;
            break;
        case 0x22:
            colpix1 = 0x5;
            break;
        case 0x28:
            colpix1 = 0x6;
            break;
        case 0x2A:
            colpix1 = 0x7;
            break;
        case 0x80:
            colpix1 = 0x8;
            break;
        case 0x82:
            colpix1 = 0x9;
            break;
        case 0x88:
            colpix1 = 0xA;
            break;
        case 0x8A:
            colpix1 = 0xB;
            break;
        case 0xA0:
            colpix1 = 0xC;
            break;
        case 0xA2:
            colpix1 = 0xD;
            break;
        case 0xA8:
            colpix1 = 0xE;
            break;
        case 0xAA:
            colpix1 = 0xF;
            break;
    }

    switch (iobyte & 0x55)                 // calculate the colour of pixel 2
    {
        case 0x00:
            colpix2 = 0x0;
            break;
        case 0x01:
            colpix2 = 0x1;
            break;
        case 0x04:
            colpix2 = 0x2;
            break;
        case 0x05:
            colpix2 = 0x3;
            break;
        case 0x10:
            colpix2 = 0x4;
            break;
        case 0x11:
            colpix2 = 0x5;
            break;
        case 0x14:
            colpix2 = 0x6;
            break;
        case 0x15:
            colpix2 = 0x7;
            break;
        case 0x40:
            colpix2 = 0x8;
            break;
        case 0x41:
            colpix2 = 0x9;
            break;
        case 0x44:
            colpix2 = 0xA;
            break;
        case 0x45:
            colpix2 = 0xB;
            break;
        case 0x50:
            colpix2 = 0xC;
            break;
        case 0x51:
            colpix2 = 0xD;
            break;
        case 0x54:
            colpix2 = 0xE;
            break;
        case 0x55:
            colpix2 = 0xF;
            break;
    }
    // only a twenty column mode is
    // officially supported,
    // so no need to scale output
    putpixel(x_cord + 0, virt_y_cord, colpix1);
    putpixel(x_cord + 1, virt_y_cord, colpix1);
    putpixel(x_cord + 2, virt_y_cord, colpix1);
    putpixel(x_cord + 3, virt_y_cord, colpix1);
    putpixel(x_cord + 4, virt_y_cord, colpix2);
    putpixel(x_cord + 5, virt_y_cord, colpix2);
    putpixel(x_cord + 6, virt_y_cord, colpix2);
    putpixel(x_cord + 7, virt_y_cord, colpix2);

    if (!(y_cord & 3))                          // if the y_cord was scaled,
        // fill in the pixels for the
    {                                         // original line
        virt_y_cord--;
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix1);
        putpixel(x_cord + 3, virt_y_cord, colpix1);
        putpixel(x_cord + 4, virt_y_cord, colpix2);
        putpixel(x_cord + 5, virt_y_cord, colpix2);
        putpixel(x_cord + 6, virt_y_cord, colpix2);
        putpixel(x_cord + 7, virt_y_cord, colpix2);
    }
}